

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_sqrt>(Mat *a,Option *opt)

{
  long lVar1;
  int iVar2;
  long *in_RDI;
  undefined1 auVar3 [16];
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_sqrt op;
  Mat *m;
  int local_184;
  undefined1 (*local_138) [16];
  int local_130;
  
  lVar1 = in_RDI[7];
  iVar2 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_130 = 0; local_130 < (int)lVar1; local_130 = local_130 + 1) {
    local_138 = (undefined1 (*) [16])(*in_RDI + in_RDI[8] * (long)local_130 * in_RDI[2]);
    for (local_184 = 0; local_184 + 3 < iVar2; local_184 = local_184 + 4) {
      auVar3 = sqrtps(*local_138,*local_138);
      *local_138 = auVar3;
      local_138 = local_138 + 1;
    }
    for (; local_184 < iVar2; local_184 = local_184 + 1) {
      *(float *)*local_138 = SQRT(*(float *)*local_138);
      local_138 = (undefined1 (*) [16])(*local_138 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}